

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Symbol __thiscall
google::protobuf::DescriptorBuilder::FindSymbol(DescriptorBuilder *this,string *name,bool build_it)

{
  bool bVar1;
  Type TVar2;
  size_type sVar3;
  reference ppFVar4;
  _Self local_48;
  _Self local_40;
  const_iterator it;
  FileDescriptor *file;
  Symbol result;
  bool build_it_local;
  string *name_local;
  DescriptorBuilder *this_local;
  
  result.ptr_._7_1_ = build_it;
  file = (FileDescriptor *)FindSymbolNotEnforcingDeps(this,name,build_it);
  bVar1 = Symbol::IsNull((Symbol *)&file);
  if (bVar1) {
    this_local = (DescriptorBuilder *)file;
  }
  else if ((this->pool_->enforce_dependencies_ & 1U) == 0) {
    this_local = (DescriptorBuilder *)file;
  }
  else {
    it._M_node = (_Base_ptr)Symbol::GetFile((Symbol *)&file);
    if ((it._M_node == (_Base_ptr)this->file_) ||
       (sVar3 = std::
                set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ::count(&this->dependencies_,(key_type *)&it), sVar3 != 0)) {
      this_local = (DescriptorBuilder *)file;
    }
    else {
      TVar2 = Symbol::type((Symbol *)&file);
      if (TVar2 == PACKAGE) {
        bVar1 = IsInPackage(this,this->file_,name);
        if (bVar1) {
          return (Symbol)(SymbolBase *)file;
        }
        local_40._M_node =
             (_Base_ptr)
             std::
             set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             ::begin(&this->dependencies_);
        while( true ) {
          local_48._M_node =
               (_Base_ptr)
               std::
               set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               ::end(&this->dependencies_);
          bVar1 = std::operator!=(&local_40,&local_48);
          if (!bVar1) break;
          ppFVar4 = std::_Rb_tree_const_iterator<const_google::protobuf::FileDescriptor_*>::
                    operator*(&local_40);
          if (*ppFVar4 != (FileDescriptor *)0x0) {
            ppFVar4 = std::_Rb_tree_const_iterator<const_google::protobuf::FileDescriptor_*>::
                      operator*(&local_40);
            bVar1 = IsInPackage(this,*ppFVar4,name);
            if (bVar1) {
              return (Symbol)(SymbolBase *)file;
            }
          }
          std::_Rb_tree_const_iterator<const_google::protobuf::FileDescriptor_*>::operator++
                    (&local_40);
        }
      }
      this->possible_undeclared_dependency_ = (FileDescriptor *)it._M_node;
      std::__cxx11::string::operator=
                ((string *)&this->possible_undeclared_dependency_name_,(string *)name);
      this_local = (anonymous_namespace)::kNullSymbol;
    }
  }
  return (Symbol)(SymbolBase *)this_local;
}

Assistant:

Symbol DescriptorBuilder::FindSymbol(const std::string& name, bool build_it) {
  Symbol result = FindSymbolNotEnforcingDeps(name, build_it);

  if (result.IsNull()) return result;

  if (!pool_->enforce_dependencies_) {
    // Hack for CompilerUpgrader, and also used for lazily_build_dependencies_
    return result;
  }

  // Only find symbols which were defined in this file or one of its
  // dependencies.
  const FileDescriptor* file = result.GetFile();
  if (file == file_ || dependencies_.count(file) > 0) {
    return result;
  }

  if (result.type() == Symbol::PACKAGE) {
    // Arg, this is overcomplicated.  The symbol is a package name.  It could
    // be that the package was defined in multiple files.  result.GetFile()
    // returns the first file we saw that used this package.  We've determined
    // that that file is not a direct dependency of the file we are currently
    // building, but it could be that some other file which *is* a direct
    // dependency also defines the same package.  We can't really rule out this
    // symbol unless none of the dependencies define it.
    if (IsInPackage(file_, name)) return result;
    for (std::set<const FileDescriptor*>::const_iterator it =
             dependencies_.begin();
         it != dependencies_.end(); ++it) {
      // Note:  A dependency may be nullptr if it was not found or had errors.
      if (*it != nullptr && IsInPackage(*it, name)) return result;
    }
  }

  possible_undeclared_dependency_ = file;
  possible_undeclared_dependency_name_ = name;
  return kNullSymbol;
}